

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O0

void QJsonPrivate::Writer::valueToJson(QCborValue *v,QByteArray *json,int indent,bool compact)

{
  bool bVar1;
  QCborContainerPrivate *this;
  qsizetype qVar2;
  byte in_CL;
  QByteArray *in_RSI;
  QCborValue *in_RDI;
  QCborContainerPrivate *container;
  char ch;
  
  this = Value::container(in_RDI);
  QByteArray::size(in_RSI);
  if (this == (QCborContainerPrivate *)0x0) {
    ch = '\0';
  }
  else {
    qVar2 = QList<QtCbor::Element>::size(&this->elements);
    ch = (char)((ulong)qVar2 >> 0x38);
  }
  QByteArray::reserve((QByteArray *)this,(qsizetype)in_RDI);
  valueContentToJson(v,json,indent,compact);
  if (((in_CL & 1) == 0) &&
     ((bVar1 = ::QCborValue::isMap((QCborValue *)0x4a4980), bVar1 ||
      (bVar1 = ::QCborValue::isArray((QCborValue *)0x4a498e), bVar1)))) {
    QByteArray::append(in_RSI,ch);
  }
  return;
}

Assistant:

void Writer::valueToJson(const QCborValue &v, QByteArray &json, int indent, bool compact)
{
    const QCborContainerPrivate *container = QJsonPrivate::Value::container(v);
    json.reserve(json.size() + (container ? container->elements.size() : 16));
    valueContentToJson(v, json, indent, compact);

    if (!compact && (v.isMap() || v.isArray())) {
        json.append('\n');
    }
}